

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::
tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::insert_key_range_internal
          (tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,key_type start_key,size_t count,bool bypass_verifier)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  uint64_t key;
  ulong uVar6;
  key_type k;
  value_view v;
  key_encoder local_158;
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_40;
  uint local_34;
  
  uVar1 = *(undefined8 *)start_key._M_ptr;
  uVar6 = (ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
          (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
          (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
          uVar1 << 0x38;
  local_158.buf = local_158.ibuf;
  local_158.cap = 0x100;
  if (uVar6 < uVar6 + count) {
    puVar5 = test_values + uVar6 * 0x10;
    lVar4 = uVar6 * 0x10 + 0x2fa8b8;
    local_34 = (uint)bypass_verifier;
    local_40 = this;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      local_158.off = 0;
      key_encoder::ensure_available(&local_158,8);
      lVar3 = (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffc) * -0x18;
      *(ulong *)(local_158.buf + local_158.off) =
           uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
           (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
           (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
      k._M_extent._M_extent_value = local_158.off + 8;
      k._M_ptr = local_158.buf;
      v._M_extent._M_extent_value = *(size_t *)(lVar4 + lVar3);
      v._M_ptr = *(pointer *)(puVar5 + lVar3);
      local_158.off = k._M_extent._M_extent_value;
      insert_internal(local_40,k,v,SUB41(local_34,0));
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 0x10;
      lVar4 = lVar4 + 0x10;
      count = count - 1;
    } while (count != 0);
    if (0x100 < local_158.cap) {
      free(local_158.buf);
    }
  }
  return;
}

Assistant:

void insert_key_range_internal(key_type start_key, std::size_t count,
                                 bool bypass_verifier = false) {
    if constexpr (std::is_same_v<key_type, key_view>) {
      // decode to figure out the start key for the loop.
      unodb::key_decoder dec(start_key);
      std::uint64_t start_key_dec;
      dec.decode(start_key_dec);
      unodb::key_encoder enc;
      for (auto key = start_key_dec; key < start_key_dec + count; ++key) {
        insert(enc.reset().encode(key).get_key_view(),
               test_values[key % test_values.size()], bypass_verifier);
      }
    } else {
      for (auto key = start_key; key < start_key + count; ++key) {
        insert(key, test_values[key % test_values.size()], bypass_verifier);
      }
    }
  }